

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_source.cpp
# Opt level: O3

void __thiscall
ImportSource_importSourceSharedAcrossImporters_Test::
~ImportSource_importSourceSharedAcrossImporters_Test
          (ImportSource_importSourceSharedAcrossImporters_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ImportSource, importSourceSharedAcrossImporters)
{
    auto i1 = libcellml::Importer::create();
    auto imp = libcellml::ImportSource::create();

    // Add import source to an importer.
    EXPECT_TRUE(i1->addImportSource(imp));

    // Add import source to another importer.
    auto i2 = libcellml::Importer::create();
    EXPECT_TRUE(i2->addImportSource(imp));

    // Expect that first importer has an import source
    EXPECT_EQ(size_t(1), i1->importSourceCount());
    EXPECT_EQ(imp, i1->importSource(0));
    EXPECT_TRUE(i1->removeImportSource(imp));

    // and that we can get it and remove it from the second.
    EXPECT_EQ(size_t(1), i2->importSourceCount());
    EXPECT_EQ(imp, i2->importSource(0));
    EXPECT_TRUE(i2->removeImportSource(imp));
}